

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_1::isCoreFilterableFormat
               (deUint32 format,DepthStencilMode mode)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar1 = glu::isCompressedFormat(format);
  bVar2 = isDepthFormat(format,mode);
  bVar3 = isStencilFormat(format,mode);
  bVar4 = true;
  if ((format != 0x80e1 && !bVar1) &&
      (0x19U >> ((byte)(format - 0x1906) & 0x1f) & format - 0x1906 < 5) == 0) {
    if (!bVar2 && !bVar3) {
      bVar1 = glu::isGLInternalColorFormatFilterable(format);
      return bVar1;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool isCoreFilterableFormat (deUint32 format, tcu::Sampler::DepthStencilMode mode)
{
	const bool	isLuminanceOrAlpha		= (format == GL_LUMINANCE || format == GL_ALPHA || format == GL_LUMINANCE_ALPHA); // special case for luminance/alpha
	const bool	isUnsizedColorFormat	= (format == GL_BGRA);
	const bool	isCompressed			= glu::isCompressedFormat(format);
	const bool	isDepth					= isDepthFormat(format, mode);
	const bool	isStencil				= isStencilFormat(format, mode);

	// special cases
	if (isLuminanceOrAlpha || isUnsizedColorFormat || isCompressed)
		return true;
	if (isStencil || isDepth)
		return false;

	// color case
	return glu::isGLInternalColorFormatFilterable(format);
}